

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateDSTests.cpp
# Opt level: O2

int __thiscall
vkt::DynamicState::DynamicStateDSTests::init(DynamicStateDSTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  int extraout_EAX;
  mapped_type *ppcVar2;
  TestNode *pTVar3;
  StencilParamsBasicTestCase *pSVar4;
  Vec4 *in_stack_fffffffffffffee0;
  string local_118;
  string local_f8;
  ShaderMap shaderPaths;
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_a8;
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_78;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined1 *puStack_30;
  
  shaderPaths._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &shaderPaths._M_t._M_impl.super__Rb_tree_header._M_header;
  shaderPaths._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  shaderPaths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  shaderPaths._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118._M_dataplus._M_p._0_4_ = 0;
  shaderPaths._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       shaderPaths._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[](&shaderPaths,(key_type *)&local_118);
  *ppcVar2 = "vulkan/dynamic_state/VertexFetch.vert";
  local_118._M_dataplus._M_p._0_4_ = 1;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[](&shaderPaths,(key_type *)&local_118);
  *ppcVar2 = "vulkan/dynamic_state/VertexFetch.frag";
  pTVar3 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"depth_bounds",(allocator<char> *)&stack0xfffffffffffffee7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"Perform depth bounds test",
             (allocator<char> *)&stack0xfffffffffffffee6);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree(&local_78,&shaderPaths._M_t);
  TestCase::TestCase((TestCase *)pTVar3,pTVar1,&local_118,&local_f8);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__InstanceFactory_00bd5cd0;
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              *)(pTVar3 + 1),&local_78);
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree(&local_78);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  pSVar4 = (StencilParamsBasicTestCase *)operator_new(0x90);
  local_38 = 0;
  puStack_30 = &DAT_3f8000003f800000;
  DynamicState::anon_unknown_0::StencilParamsBasicTestCase::StencilParamsBasicTestCase
            (pSVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"stencil_params_basic_1",
             "Perform basic stencil test 1",0xd,6,(deUint32)&local_38,in_stack_fffffffffffffee0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  pSVar4 = (StencilParamsBasicTestCase *)operator_new(0x90);
  local_48 = 0x3f80000000000000;
  uStack_40 = 0x3f80000000000000;
  DynamicState::anon_unknown_0::StencilParamsBasicTestCase::StencilParamsBasicTestCase
            (pSVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"stencil_params_basic_2",
             "Perform basic stencil test 2",6,2,(deUint32)&local_48,in_stack_fffffffffffffee0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  pTVar3 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"stencil_params_advanced",
             (allocator<char> *)&stack0xfffffffffffffee7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"Perform advanced stencil test",
             (allocator<char> *)&stack0xfffffffffffffee6);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree(&local_a8,&shaderPaths._M_t);
  TestCase::TestCase((TestCase *)pTVar3,pTVar1,&local_118,&local_f8);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__InstanceFactory_00bd5d70;
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              *)(pTVar3 + 1),&local_a8);
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree(&local_a8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree(&shaderPaths._M_t);
  return extraout_EAX;
}

Assistant:

void DynamicStateDSTests::init (void)
{
	ShaderMap shaderPaths;
	shaderPaths[glu::SHADERTYPE_VERTEX] = "vulkan/dynamic_state/VertexFetch.vert";
	shaderPaths[glu::SHADERTYPE_FRAGMENT] = "vulkan/dynamic_state/VertexFetch.frag";

	addChild(new InstanceFactory<DepthBoundsParamTestInstance>(m_testCtx, "depth_bounds", "Perform depth bounds test", shaderPaths));
	addChild(new StencilParamsBasicTestCase(m_testCtx, "stencil_params_basic_1", "Perform basic stencil test 1", 0x0D, 0x06, 0x05, tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f)));
	addChild(new StencilParamsBasicTestCase(m_testCtx, "stencil_params_basic_2", "Perform basic stencil test 2", 0x06, 0x02, 0x05, tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f)));
	addChild(new InstanceFactory<StencilParamsAdvancedTestInstance>(m_testCtx, "stencil_params_advanced", "Perform advanced stencil test", shaderPaths));
}